

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O0

void __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>::
SimpleDictionaryTypeHandlerBase
          (SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true> *this,
          Recycler *recycler,int slotCapacity,uint16 inlineSlotCapacity,uint16 offsetOfInlineSlots,
          bool isLocked,bool isShared)

{
  code *pcVar1;
  AllocatorType *allocator;
  byte bVar2;
  bool bVar3;
  int capacity;
  undefined4 *puVar4;
  Recycler *pRVar5;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
  *this_00;
  byte bVar6;
  TrackAllocData local_58;
  nullptr_t local_30;
  undefined1 local_22;
  undefined1 local_21;
  uint16 local_20;
  uint16 local_1e;
  bool isShared_local;
  int iStack_1c;
  bool isLocked_local;
  uint16 offsetOfInlineSlots_local;
  uint16 inlineSlotCapacity_local;
  int slotCapacity_local;
  Recycler *recycler_local;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true> *this_local;
  
  local_22 = isShared;
  bVar2 = 0;
  if (isLocked) {
    bVar2 = 4;
  }
  bVar6 = 0;
  if (isShared) {
    bVar6 = 0x18;
  }
  local_21 = isLocked;
  local_20 = offsetOfInlineSlots;
  local_1e = inlineSlotCapacity;
  iStack_1c = slotCapacity;
  _offsetOfInlineSlots_local = recycler;
  recycler_local = (Recycler *)this;
  DynamicTypeHandler::DynamicTypeHandler
            (&this->super_DynamicTypeHandler,slotCapacity,inlineSlotCapacity,offsetOfInlineSlots,
             bVar2 | 1 | bVar6);
  (this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler = (_func_int **)&PTR_GetCppName_01e49b90
  ;
  Memory::
  WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>_>
  ::WriteBarrierPtr(&this->propertyMap);
  local_30 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicObject>_>::WriteBarrierPtr
            (&this->singletonInstance,&local_30);
  this->field_0x28 = this->field_0x28 & 0xfe | 1;
  this->field_0x28 = this->field_0x28 & 0xfd;
  this->field_0x28 = this->field_0x28 & 0xfb;
  this->numDeletedProperties = '\0';
  this->nextPropertyIndex = 0;
  DynamicTypeHandler::SetIsInlineSlotCapacityLocked(&this->super_DynamicTypeHandler);
  if (0xfffe < iStack_1c) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x136,"(slotCapacity <= MaxPropertyIndexSize)",
                                "slotCapacity <= MaxPropertyIndexSize");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pRVar5 = _offsetOfInlineSlots_local;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_58,
             (type_info *)
             &JsUtil::
              BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
              ::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
             ,0x137);
  pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,&local_58);
  this_00 = (BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
             *)new<Memory::Recycler>(0x38,pRVar5,0x43c4b0);
  allocator = _offsetOfInlineSlots_local;
  capacity = DynamicTypeHandler::GetSlotCapacity(&this->super_DynamicTypeHandler);
  JsUtil::
  BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
  ::BaseDictionary(this_00,allocator,capacity);
  Memory::
  WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>_>
  ::operator=(&this->propertyMap,this_00);
  return;
}

Assistant:

SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SimpleDictionaryTypeHandlerBase(Recycler * recycler, int slotCapacity, uint16 inlineSlotCapacity, uint16 offsetOfInlineSlots, bool isLocked, bool isShared) :
        // Do not RoundUp passed in slotCapacity. This may be called by ConvertTypeHandler for an existing DynamicObject and should use the real existing slotCapacity.
        DynamicTypeHandler(slotCapacity, inlineSlotCapacity, offsetOfInlineSlots, DefaultFlags | (isLocked ? IsLockedFlag : 0) | (isShared ? (MayBecomeSharedFlag | IsSharedFlag) : 0)),
        nextPropertyIndex(0),
        singletonInstance(nullptr),
        _gc_tag(true),
        isUnordered(false),
        hasNamelessPropertyId(false),
        numDeletedProperties(0)
    {
        SetIsInlineSlotCapacityLocked();
        Assert(slotCapacity <= MaxPropertyIndexSize);
        propertyMap = RecyclerNew(recycler, SimplePropertyDescriptorMap, recycler, this->GetSlotCapacity());
    }